

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

void ft_glyphslot_free_bitmap(FT_GlyphSlot slot)

{
  uchar *puVar1;
  FT_Memory pFVar2;
  FT_Slot_Internal pFVar3;
  uint uVar4;
  
  pFVar3 = slot->internal;
  if ((pFVar3 == (FT_Slot_Internal)0x0) || (uVar4 = pFVar3->flags, (uVar4 & 1) == 0)) {
    (slot->bitmap).buffer = (uchar *)0x0;
  }
  else {
    puVar1 = (slot->bitmap).buffer;
    if (puVar1 != (uchar *)0x0) {
      pFVar2 = slot->face->memory;
      (*pFVar2->free)(pFVar2,puVar1);
      pFVar3 = slot->internal;
      uVar4 = pFVar3->flags;
    }
    (slot->bitmap).buffer = (uchar *)0x0;
    pFVar3->flags = uVar4 & 0xfffffffe;
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  ft_glyphslot_free_bitmap( FT_GlyphSlot  slot )
  {
    if ( slot->internal && ( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
    {
      FT_Memory  memory = FT_FACE_MEMORY( slot->face );


      FT_FREE( slot->bitmap.buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }
    else
    {
      /* assume that the bitmap buffer was stolen or not */
      /* allocated from the heap                         */
      slot->bitmap.buffer = NULL;
    }
  }